

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UChar32 __thiscall icu_63::anon_unknown_16::NFDIterator::nextCodePoint(NFDIterator *this)

{
  UChar UVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar2 = this->index;
  if (-1 < (int)uVar2) {
    if (uVar2 != this->length) {
      this->index = uVar2 + 1;
      UVar1 = this->decomp[uVar2];
      uVar4 = (uint)(ushort)UVar1;
      if ((UVar1 & 0xfc00U) == 0xd800) {
        this->index = uVar2 + 2;
        uVar4 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)this->decomp[(ulong)uVar2 + 1] +
                0xfca02400;
      }
      return uVar4;
    }
    this->index = -1;
  }
  iVar3 = (*(this->super_UObject)._vptr_UObject[3])();
  return iVar3;
}

Assistant:

UChar32 nextCodePoint() {
        if(index >= 0) {
            if(index == length) {
                index = -1;
            } else {
                UChar32 c;
                U16_NEXT_UNSAFE(decomp, index, c);
                return c;
            }
        }
        return nextRawCodePoint();
    }